

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryUtils.hpp
# Opt level: O2

void OpenMD::Utils::details::lifted_deleter<OpenMD::CutoffGroup*>(CutoffGroup *val)

{
  if (val != (CutoffGroup *)0x0) {
    std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base
              ((_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)val);
  }
  operator_delete(val,0x40);
  return;
}

Assistant:

void lifted_deleter(T val) {
      delete val;
    }